

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

void Abc_NtkDetectClassesTest2(Abc_Ntk_t *pNtk,int fVerbose,int fVeryVerbose)

{
  Vec_Int_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Wec_t *__ptr;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  Vec_Wec_t *vCos;
  Vec_Wec_t *local_38;
  
  pVVar9 = pNtk->vCis;
  iVar6 = pVVar9->nSize;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar3->pArray = piVar4;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      Vec_IntPush(pVVar3,*(int *)((long)pVVar9->pArray[lVar7] + 0x10));
      lVar7 = lVar7 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar7 < pVVar9->nSize);
  }
  __ptr = Abc_NtkDetectObjClasses(pNtk,pVVar3,&local_38);
  iVar6 = __ptr->nSize;
  if (0 < (long)iVar6) {
    pVVar1 = __ptr->pArray;
    uVar8 = 0;
    do {
      printf(" %4d : {",uVar8 & 0xffffffff);
      if (0 < pVVar1[uVar8].nSize) {
        lVar7 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar1[uVar8].pArray[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar1[uVar8].nSize);
      }
      puts(" }");
      uVar8 = uVar8 + 1;
    } while (uVar8 != (long)iVar6);
  }
  if (0 < local_38->nSize) {
    uVar8 = 0;
    do {
      pVVar1 = local_38->pArray;
      printf(" %4d : {",uVar8 & 0xffffffff);
      if (0 < pVVar1[uVar8].nSize) {
        lVar7 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar1[uVar8].pArray[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVVar1[uVar8].nSize);
      }
      puts(" }");
      uVar8 = uVar8 + 1;
    } while ((long)uVar8 < (long)local_38->nSize);
  }
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  iVar6 = __ptr->nCap;
  pVVar3 = __ptr->pArray;
  if ((long)iVar6 < 1) {
    if (pVVar3 != (Vec_Int_t *)0x0) goto LAB_002a7a71;
  }
  else {
    lVar7 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar3->pArray + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar3->pArray + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar6 * 0x10 != lVar7);
LAB_002a7a71:
    free(pVVar3);
  }
  free(__ptr);
  iVar6 = local_38->nCap;
  pVVar3 = local_38->pArray;
  if (iVar6 < 1) {
    if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_002a7acf;
  }
  else {
    lVar7 = 8;
    lVar10 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar3->nCap + lVar7);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        pVVar3 = local_38->pArray;
        *(undefined8 *)((long)&pVVar3->nCap + lVar7) = 0;
        iVar6 = local_38->nCap;
      }
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar10 < iVar6);
  }
  free(pVVar3);
LAB_002a7acf:
  free(local_38);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest2( Abc_Ntk_t * pNtk, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vObjs;
    Vec_Wec_t * vRes, * vCos;
    // for testing, create the set of object IDs for all combinational inputs (CIs)
    Abc_Obj_t * pObj; int i;
    vObjs = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vObjs, Abc_ObjId(pObj) );
    // compute equivalence classes of CIs and print them
    vRes = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCos );
    Vec_WecPrint( vRes, 0 );
    Vec_WecPrint( vCos, 0 );
    // clean up
    Vec_IntFree( vObjs );
    Vec_WecFree( vRes );
    Vec_WecFree( vCos );
}